

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::_reduce(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
          *this)

{
  __node_base_ptr *this_00;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  iterator __position;
  node_ptr plVar1;
  __node_base_ptr p_Var2;
  undefined1 *puVar3;
  pointer pPVar4;
  pointer pvVar5;
  mapped_type *pmVar6;
  Delete_disposer DVar7;
  _Hash_node_base *p_Var8;
  Column *source;
  __node_base_ptr p_Var9;
  ulong uVar10;
  pointer pPVar11;
  ulong uVar12;
  Index columnIndex;
  uint uVar13;
  __node_base_ptr p_Var14;
  Column_support *this_02;
  long lVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  pointer this_03;
  float *pfVar16;
  Index i;
  int dim;
  Index pivotColumnNumber;
  Pos_index nullDeath;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columnsByDim;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  negativeColumns;
  float local_c0;
  int local_bc;
  anon_class_8_1_e4bd5e45 local_b8;
  uint local_ac;
  anon_class_1_0_00000001 local_a8;
  anon_class_1_0_00000001 local_a7;
  anon_class_1_0_00000001 local_a6;
  anon_class_1_0_00000001 local_a5;
  uint local_a4;
  vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
  *local_a0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  float *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_a4 = 0xffffffff;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_68,
               (ulong)(uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor,
               (hash<unsigned_int> *)&local_98,(key_equal *)&local_b8,(allocator_type *)&local_bc);
  local_bc = *(int *)&this[-1].barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_98,(long)local_bc + 1,(allocator_type *)&local_b8);
  pvVar5 = local_98.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_03 = local_98.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_03 != pvVar5; this_03 = this_03 + 1
      ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (this_03,(ulong)(uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor
              );
  }
  local_c0 = 0.0;
  if (this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor != 0.0) {
    do {
      lVar15 = (long)local_bc;
      local_b8.targetColumn._0_4_ = local_c0;
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this[1].super_type.map_._M_h._M_bucket_count,(key_type *)&local_b8);
      this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                (local_98.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                (lVar15 - (pmVar6->super_Column_dimension_option).dim_));
      __position._M_current = *(uint **)(this_01 + 8);
      if (__position._M_current == *(uint **)(this_01 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_01,__position,(uint *)&local_c0);
      }
      else {
        *__position._M_current = (uint)local_c0;
        *(uint **)(this_01 + 8) = __position._M_current + 1;
      }
      local_c0 = (float)((int)local_c0 + 1);
    } while ((uint)local_c0 < (uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor
            );
  }
  local_80 = local_98.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &this[-1].super_type.map_._M_h._M_single_bucket;
    local_a0 = (vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                *)&this->barcode_;
    do {
      pfVar16 = (float *)((local_98.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
      local_70 = (float *)((local_98.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
      local_78 = local_98.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (pfVar16 != local_70) {
        do {
          local_c0 = *pfVar16;
          DVar7.col_ = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                       ::get_column((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                                     *)this_00,(Index)local_c0);
          this_02 = &(DVar7.col_)->column_;
          plVar1 = ((DVar7.col_)->column_).super_type.data_.root_plus_size_.m_header.super_node.
                   next_;
          if (plVar1 == (node_ptr)0x0 || plVar1 == (node_ptr)this_02) {
            p_Var2 = local_68._M_buckets[(ulong)(uint)local_c0 % local_68._M_bucket_count];
            p_Var9 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var9 = p_Var2, p_Var14 = p_Var2->_M_nxt,
               local_c0 != *(float *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var8 = p_Var14->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
                p_Var9 = (__node_base_ptr)0x0;
                if (((ulong)(uint)*(float *)&p_Var8[1]._M_nxt % local_68._M_bucket_count !=
                     (ulong)(uint)local_c0 % local_68._M_bucket_count) ||
                   (p_Var9 = p_Var14, p_Var14 = p_Var8, local_c0 == *(float *)&p_Var8[1]._M_nxt))
                goto LAB_001742d0;
              }
              p_Var9 = (__node_base_ptr)0x0;
            }
LAB_001742d0:
            if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                        (local_a0,(uint *)&local_c0,&local_a4,&local_bc);
            }
          }
          else {
            uVar13 = *(uint *)&((DVar7.col_)->column_).super_type.data_.root_plus_size_.m_header.
                               super_node.prev_[1].next_;
            uVar10 = (this->idToPosition_)._M_h._M_bucket_count;
            uVar12 = (ulong)uVar13 % uVar10;
            p_Var2 = (this->idToPosition_)._M_h._M_buckets[uVar12];
            p_Var9 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var9 = p_Var2, p_Var14 = p_Var2->_M_nxt,
               uVar13 != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var8 = p_Var14->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
                p_Var9 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar10 != uVar12) ||
                   (p_Var9 = p_Var14, p_Var14 = p_Var8, uVar13 == *(uint *)&p_Var8[1]._M_nxt))
                goto LAB_001742ff;
              }
              p_Var9 = (__node_base_ptr)0x0;
            }
LAB_001742ff:
            if (p_Var9 == (__node_base_ptr)0x0) {
              p_Var8 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var8 = p_Var9->_M_nxt;
            }
            local_ac = uVar13;
            if (p_Var8 != (_Hash_node_base *)0x0) {
              local_ac = *(uint *)((long)&p_Var8[1]._M_nxt + 4);
            }
            p_Var2 = local_68._M_buckets[(ulong)local_ac % local_68._M_bucket_count];
            p_Var9 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var9 = p_Var2, p_Var14 = p_Var2->_M_nxt,
               local_ac != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var8 = p_Var14->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
                p_Var9 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var8[1]._M_nxt % local_68._M_bucket_count !=
                     (ulong)local_ac % local_68._M_bucket_count) ||
                   (p_Var9 = p_Var14, p_Var14 = p_Var8, local_ac == *(uint *)&p_Var8[1]._M_nxt))
                goto LAB_00174378;
              }
              p_Var9 = (__node_base_ptr)0x0;
            }
LAB_00174378:
            if (p_Var9 == (__node_base_ptr)0x0) {
              p_Var8 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var8 = p_Var9->_M_nxt;
            }
            if (p_Var8 == (_Hash_node_base *)0x0) {
              columnIndex = 0xffffffff;
            }
            else {
              columnIndex = *(Index *)((long)&p_Var8[1]._M_nxt + 4);
            }
            while ((uVar13 != 0xffffffff && (columnIndex != 0xffffffff))) {
              source = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                       ::get_column((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                                     *)this_00,columnIndex);
              local_b8.targetColumn = DVar7.col_;
              _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)___::persistence_matrix::Column_types)7,true,false,true,true,true>>::Matrix_column_tag,1u>,false>___1_>
                        (source,DVar7.col_,&local_a5,&local_b8,&local_a6,&local_a7,&local_a8);
              puVar3 = (undefined1 *)
                       (this_02->super_type).data_.root_plus_size_.m_header.super_node.next_;
              uVar13 = 0xffffffff;
              if ((Column_support *)puVar3 != this_02 && puVar3 != (undefined1 *)0x0) {
                uVar13 = *(uint *)&((DVar7.col_)->column_).super_type.data_.root_plus_size_.m_header
                                   .super_node.prev_[1].next_;
              }
              uVar10 = (this->idToPosition_)._M_h._M_bucket_count;
              uVar12 = (ulong)uVar13 % uVar10;
              p_Var2 = (this->idToPosition_)._M_h._M_buckets[uVar12];
              p_Var9 = (__node_base_ptr)0x0;
              if ((p_Var2 != (__node_base_ptr)0x0) &&
                 (p_Var9 = p_Var2, p_Var14 = p_Var2->_M_nxt,
                 uVar13 != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
                while (p_Var8 = p_Var14->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
                  p_Var9 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar10 != uVar12) ||
                     (p_Var9 = p_Var14, p_Var14 = p_Var8, uVar13 == *(uint *)&p_Var8[1]._M_nxt))
                  goto LAB_00174459;
                }
                p_Var9 = (__node_base_ptr)0x0;
              }
LAB_00174459:
              if (p_Var9 == (__node_base_ptr)0x0) {
                p_Var8 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var8 = p_Var9->_M_nxt;
              }
              local_ac = uVar13;
              if (p_Var8 != (_Hash_node_base *)0x0) {
                local_ac = *(uint *)((long)&p_Var8[1]._M_nxt + 4);
              }
              p_Var2 = local_68._M_buckets[(ulong)local_ac % local_68._M_bucket_count];
              p_Var9 = (__node_base_ptr)0x0;
              if ((p_Var2 != (__node_base_ptr)0x0) &&
                 (p_Var9 = p_Var2, p_Var14 = p_Var2->_M_nxt,
                 local_ac != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
                while (p_Var8 = p_Var14->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
                  p_Var9 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var8[1]._M_nxt % local_68._M_bucket_count !=
                       (ulong)local_ac % local_68._M_bucket_count) ||
                     (p_Var9 = p_Var14, p_Var14 = p_Var8, local_ac == *(uint *)&p_Var8[1]._M_nxt))
                  goto LAB_001744d2;
                }
                p_Var9 = (__node_base_ptr)0x0;
              }
LAB_001744d2:
              if (p_Var9 == (__node_base_ptr)0x0) {
                p_Var8 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var8 = p_Var9->_M_nxt;
              }
              if (p_Var8 == (_Hash_node_base *)0x0) {
                columnIndex = 0xffffffff;
              }
              else {
                columnIndex = *(Index *)((long)&p_Var8[1]._M_nxt + 4);
              }
            }
            if (uVar13 != 0xffffffff) {
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<unsigned_int&,unsigned_int&>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_68,&local_ac,&local_c0);
              DVar7.col_ = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                           ::get_column((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                                         *)this_00,local_ac);
              boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              ::
              clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>::Delete_disposer>
                        ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                          *)&(DVar7.col_)->column_,DVar7);
              local_b8.targetColumn._0_4_ = (float)(local_bc + -1);
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int&,int>
                        (local_a0,&local_ac,(uint *)&local_c0,(int *)&local_b8);
            }
            else {
              boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              ::
              clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>::Delete_disposer>
                        ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                          *)this_02,DVar7);
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                        (local_a0,(uint *)&local_c0,&local_a4,&local_bc);
            }
          }
          pfVar16 = pfVar16 + 1;
        } while (pfVar16 != local_70);
      }
      local_bc = local_bc + -1;
      local_98.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_78 + 1;
    } while (local_98.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_80);
  }
  pPVar11 = (this->barcode_).
            super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->barcode_).
           super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar11 != pPVar4) {
    uVar10 = ((long)pPVar4 - (long)pPVar11 >> 2) * -0x5555555555555555;
    lVar15 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
              (pPVar11,pPVar4,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
              (pPVar11,pPVar4);
  }
  local_b8.targetColumn = local_b8.targetColumn & 0xffffffff00000000;
  pPVar11 = (this->barcode_).
            super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->barcode_).
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar11) {
    uVar10 = 0;
    do {
      local_c0 = (float)pPVar11[uVar10].death;
      if (local_c0 != -NAN) {
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,unsigned_int&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->deathToBar_,&local_c0,&local_b8);
      }
      uVar10 = (ulong)((int)local_b8.targetColumn._0_4_ + 1U);
      local_b8.targetColumn._0_4_ = (float)((int)local_b8.targetColumn._0_4_ + 1U);
      pPVar11 = (this->barcode_).
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(this->barcode_).
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar11 >> 2) *
               -0x5555555555555555;
    } while (uVar10 <= uVar12 && uVar12 - uVar10 != 0);
  }
  this->isReduced_ = true;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_98);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

inline void Base_pairing<Master_matrix>::_reduce() 
{
  constexpr const Pos_index nullDeath = Master_matrix::template get_null_value<Pos_index>();
  constexpr const Index nullIndex = Master_matrix::template get_null_value<Index>();

  std::unordered_map<Index, Index> negativeColumns(_matrix()->get_number_of_columns());

  auto dim = _matrix()->get_max_dimension();
  std::vector<std::vector<Index> > columnsByDim(dim + 1);
  for (auto& v : columnsByDim) v.reserve(_matrix()->get_number_of_columns());
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    columnsByDim[dim - _matrix()->get_column_dimension(i)].push_back(i);
  }

  for (const auto& cols : columnsByDim) {
    for (Index i : cols) {
      auto& curr = _matrix()->get_column(i);
      if (curr.is_empty()) {
        if (negativeColumns.find(i) == negativeColumns.end()) {
          barcode_.emplace_back(i, nullDeath, dim);
        }
      } else {
        ID_index pivot = curr.get_pivot();
        auto it = idToPosition_.find(pivot);
        Index pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
        auto itNeg = negativeColumns.find(pivotColumnNumber);
        Index pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;

        while (pivot != Master_matrix::template get_null_value<ID_index>() &&
               pivotKiller != Master_matrix::template get_null_value<Index>()) {
          if constexpr (Master_matrix::Option_list::is_z2) {
            curr += _matrix()->get_column(pivotKiller);
          } else {
            auto& toadd = _matrix()->get_column(pivotKiller);
            typename Master_matrix::Element coef = toadd.get_pivot_value();
            auto& operators = _matrix()->colSettings_->operators;
            coef = operators.get_inverse(coef);
            operators.multiply_inplace(coef, operators.get_characteristic() - curr.get_pivot_value());
            curr.multiply_source_and_add(toadd, coef);
          }

          pivot = curr.get_pivot();
          it = idToPosition_.find(pivot);
          pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
          itNeg = negativeColumns.find(pivotColumnNumber);
          pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;
        }

        if (pivot != Master_matrix::template get_null_value<ID_index>()) {
          negativeColumns.emplace(pivotColumnNumber, i);
          _matrix()->get_column(pivotColumnNumber).clear();
          barcode_.emplace_back(pivotColumnNumber, i, dim - 1);
        } else {
          curr.clear();
          barcode_.emplace_back(i, nullDeath, dim);
        }
      }
    }
    --dim;
  }

  if constexpr (Master_matrix::Option_list::has_removable_columns) {
    // sort barcode by birth such that a removal is trivial
    std::sort(barcode_.begin(), barcode_.end(), [](const Bar& b1, const Bar& b2) { return b1.birth < b2.birth; });
    // map can only be constructed once barcode is sorted
    for (Index i = 0; i < barcode_.size(); ++i) {
      auto d = barcode_[i].death;
      if (d != Master_matrix::template get_null_value<Pos_index>()) {
        deathToBar_.emplace(d, i);
      }
    }
  }

  isReduced_ = true;
}